

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O3

void __thiscall
DatabaseSnapshot::reindex_dataset
          (DatabaseSnapshot *this,Task *task,vector<IndexType,_std::allocator<IndexType>_> *types,
          string *dataset_name)

{
  atomic_uint64_t *paVar1;
  OnDiskDataset *this_00;
  Task *pTVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  pointer pcVar4;
  OnDiskDataset *this_01;
  string *obj_name;
  _Rb_tree_node_base *p_Var5;
  runtime_error *this_02;
  Indexer indexer;
  DbChangeType local_264;
  Task *local_260;
  string local_258;
  string local_238;
  OnDiskDataset *local_218;
  pointer local_210;
  pointer local_208;
  _Any_data local_200;
  code *local_1f0;
  code *local_1e8;
  DBChange local_1e0;
  DBChange local_198;
  DBChange local_150;
  Indexer local_108;
  
  local_260 = task;
  this_01 = find_dataset(this,dataset_name);
  if (this_01 != (OnDiskDataset *)0x0) {
    Indexer::Indexer(&local_108,this,types);
    local_200._8_8_ = &local_260;
    LOCK();
    (local_260->spec_->work_estimated_).super___atomic_base<unsigned_long>._M_i =
         (this_01->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
         super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
         super__Optional_payload_base<OnDiskFileIndex>._M_payload._M_value.file_count + 1;
    UNLOCK();
    local_1e8 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/DatabaseSnapshot.cpp:176:31)>
                ::_M_invoke;
    local_1f0 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/DatabaseSnapshot.cpp:176:31)>
                ::_M_manager;
    local_200._M_unused._M_object = &local_108;
    OnDiskFileIndex::for_each_filename
              ((OnDiskFileIndex *)&this_01->files_index,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_200);
    if (local_1f0 != (code *)0x0) {
      (*local_1f0)(&local_200,&local_200,__destroy_functor);
    }
    Indexer::finalize((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                      &local_238,&local_108);
    local_210 = (pointer)local_238._M_string_length;
    pcVar4 = local_208;
    if (local_238._M_dataplus._M_p != (pointer)local_238._M_string_length) {
      psVar3 = &this_01->taints;
      local_208 = local_238._M_dataplus._M_p;
      local_218 = this_01;
      do {
        pTVar2 = local_260;
        this_00 = *(OnDiskDataset **)local_208;
        local_264 = Insert;
        obj_name = OnDiskDataset::get_name_abi_cxx11_(this_00);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
        DBChange::DBChange(&local_1e0,&local_264,obj_name,&local_258);
        std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
                  (&pTVar2->changes_,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.parameter._M_dataplus._M_p != &local_1e0.parameter.field_2) {
          operator_delete(local_1e0.parameter._M_dataplus._M_p,
                          local_1e0.parameter.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.obj_name._M_dataplus._M_p != &local_1e0.obj_name.field_2) {
          operator_delete(local_1e0.obj_name._M_dataplus._M_p,
                          local_1e0.obj_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        p_Var5 = (local_218->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pTVar2 = local_260;
        this_01 = local_218;
        pcVar4 = local_208;
        while (local_260 = pTVar2, local_218 = this_01,
              (_Rb_tree_header *)p_Var5 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header) {
          local_264 = ToggleTaint;
          local_208 = pcVar4;
          OnDiskDataset::get_id_abi_cxx11_(&local_258,this_00);
          DBChange::DBChange(&local_198,&local_264,&local_258,(string *)(p_Var5 + 1));
          std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
                    (&pTVar2->changes_,&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198.parameter._M_dataplus._M_p != &local_198.parameter.field_2) {
            operator_delete(local_198.parameter._M_dataplus._M_p,
                            local_198.parameter.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198.obj_name._M_dataplus._M_p != &local_198.obj_name.field_2) {
            operator_delete(local_198.obj_name._M_dataplus._M_p,
                            local_198.obj_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
          pTVar2 = local_260;
          this_01 = local_218;
          pcVar4 = local_208;
        }
        local_208 = pcVar4 + 8;
      } while (local_208 != local_210);
    }
    local_208 = pcVar4;
    if (local_238._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_238._M_dataplus._M_p,
                      local_238.field_2._M_allocated_capacity - (long)local_238._M_dataplus._M_p);
    }
    pTVar2 = local_260;
    local_264 = Drop;
    OnDiskDataset::get_id_abi_cxx11_(&local_258,this_01);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
    DBChange::DBChange(&local_150,&local_264,&local_258,&local_238);
    std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
              (&pTVar2->changes_,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.parameter._M_dataplus._M_p != &local_150.parameter.field_2) {
      operator_delete(local_150.parameter._M_dataplus._M_p,
                      local_150.parameter.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.obj_name._M_dataplus._M_p != &local_150.obj_name.field_2) {
      operator_delete(local_150.obj_name._M_dataplus._M_p,
                      local_150.obj_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    LOCK();
    paVar1 = &local_260->spec_->work_done_;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    Indexer::~Indexer(&local_108);
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"source dataset was not found");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DatabaseSnapshot::reindex_dataset(Task *task,
                                       const std::vector<IndexType> &types,
                                       const std::string &dataset_name) const {
    const OnDiskDataset *source = find_dataset(dataset_name);

    if (source == nullptr) {
        throw std::runtime_error("source dataset was not found");
    }

    Indexer indexer(this, types);

    task->spec().estimate_work(source->get_file_count() + 1);

    source->for_each_filename([&indexer, &task](const std::string &target) {
        spdlog::debug("Reindexing {}", target);
        indexer.index(target);
        task->spec().add_progress(1);
    });

    for (const auto *ds : indexer.finalize()) {
        task->change(DBChange(DbChangeType::Insert, ds->get_name()));
        for (const auto &taint : source->get_taints()) {
            task->change(
                DBChange(DbChangeType::ToggleTaint, ds->get_id(), taint));
        }
    }

    task->change(DBChange(DbChangeType::Drop, source->get_id()));
    task->spec().add_progress(1);
}